

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadMicroStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,MicroString *str,Arena *arena)

{
  void *pvVar1;
  LargeRepKind LVar2;
  LargeRep *r;
  MicroRep *r_00;
  StringRep *r_01;
  anon_class_16_2_77b41510 do_owned;
  anon_class_16_2_77b41510 do_micro;
  anon_class_32_4_ddc2fada do_inline;
  anon_class_16_2_90f187bb invoke_setter;
  ulong local_a0;
  anon_class_8_1_6b2701bd local_98;
  char *local_90;
  anon_class_16_2_77b41510 local_88;
  anon_class_16_2_77b41510 local_78;
  size_t local_68;
  int local_5c;
  anon_class_32_4_ddc2fada local_58;
  anon_class_16_2_90f187bb local_38;
  anon_class_24_3_c2b06966 local_28;
  
  local_28.ptr = &local_90;
  local_28.size = &local_5c;
  local_a0 = (ulong)size;
  local_98.setter = &local_28;
  local_88.size = &local_a0;
  local_58.inline_capacity = &local_68;
  local_68 = 7;
  local_88.invoke_setter = &local_38;
  pvVar1 = str->rep_;
  local_90 = ptr;
  local_78.size = local_88.size;
  local_78.invoke_setter = local_88.invoke_setter;
  local_5c = size;
  local_58.size = local_88.size;
  local_58.this = str;
  local_58.invoke_setter = local_88.invoke_setter;
  local_38.setter = local_98.setter;
  local_38.size = local_88.size;
  local_28.this = this;
  if (((ulong)pvVar1 & 3) == 0) {
    if (7 < (uint)size) goto LAB_00261641;
LAB_00261681:
    MicroString::
    SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
    ::anon_class_32_4_ddc2fada::operator()(&local_58);
  }
  else {
    if (((ulong)pvVar1 & 2) == 0) {
      if (((ulong)pvVar1 & 1) == 0) goto LAB_00261641;
      LVar2 = MicroString::large_rep_kind(str);
      if (LVar2 == kString) {
        r_01 = MicroString::string_rep(str);
        goto LAB_002616bf;
      }
      if ((LVar2 != kOwned) || (r = MicroString::large_rep(str), r->capacity < local_a0))
      goto LAB_00261641;
    }
    else {
      r_00 = MicroString::micro_rep(str);
      if (local_a0 <= r_00->capacity) goto LAB_0026166e;
LAB_00261641:
      if (arena == (Arena *)0x0) {
        MicroString::Destroy(str);
      }
      if (local_a0 <= local_68) {
        *(undefined1 *)&str->rep_ = 0;
        goto LAB_00261681;
      }
      if (local_a0 < 0x100) {
        r_00 = MicroString::AllocateMicroRep(str,local_a0,arena);
LAB_0026166e:
        MicroString::
        SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
        ::anon_class_16_2_77b41510::operator()(&local_78,r_00);
        return local_90;
      }
      if (50000000 < local_a0) {
        r_01 = MicroString::AllocateStringRep(str,arena);
LAB_002616bf:
        MicroString::
        SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
        ::anon_class_8_1_6b2701bd::operator()(&local_98,r_01);
        return local_90;
      }
      r = MicroString::AllocateOwnedRep(str,local_a0,arena);
    }
    MicroString::
    SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
    ::anon_class_16_2_77b41510::operator()(&local_88,r);
  }
  return local_90;
}

Assistant:

const char* EpsCopyInputStream::ReadMicroStringFallback(const char* ptr,
                                                        int size,
                                                        MicroString& str,
                                                        Arena* arena) {
  str.SetInChunks(size, arena, [&](auto append) {
    ptr = AppendSize(ptr, size, [&](const char* p, int s) {
      append(absl::string_view(p, s));
    });
  });
  return ptr;
}